

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  int overflow;
  int overflow_1;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  int local_80;
  int local_7c;
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  
  local_80 = 0;
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_tweak_mul_cold_2();
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_58,tweak32,&local_80);
      secp256k1_scalar_set_b32(&local_78,seckey,&local_7c);
      bVar3 = local_78.d[1] != 0;
      bVar4 = local_78.d[0] != 0;
      bVar2 = local_78.d[2] != 0;
      bVar1 = local_78.d[3] != 0;
      bVar7 = local_80 == 0;
      secp256k1_scalar_mul(&local_78,&local_78,&local_58);
      uVar6 = (uint)(((((local_58.d[1] != 0 || local_58.d[0] != 0) || local_58.d[2] != 0) ||
                      local_58.d[3] != 0) && bVar7) &&
                    ((((bVar3 || bVar4) || bVar2) || bVar1) && local_7c == 0));
      uVar5 = (ulong)(uVar6 ^ 1) - 1;
      local_78.d[0] = local_78.d[0] & uVar5;
      local_78.d[1] = local_78.d[1] & uVar5;
      local_78.d[2] = local_78.d[2] & uVar5;
      local_78.d[3] = local_78.d[3] & uVar5;
      secp256k1_scalar_get_b32(seckey,&local_78);
      return uVar6;
    }
    secp256k1_ec_seckey_tweak_mul_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}